

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O0

void __thiscall chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<char> *bVal)

{
  ChStreamOutAscii *pCVar1;
  char *pcVar2;
  ChNameValue<char> *bVal_local;
  ChArchiveAsciiDump *this_local;
  
  indent(this);
  pCVar1 = this->ostream;
  pcVar2 = ChNameValue<char>::name(bVal);
  chrono::ChStreamOutAscii::operator<<(pCVar1,pcVar2);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
  pCVar1 = this->ostream;
  pcVar2 = ChNameValue<char>::value(bVal);
  chrono::ChStreamOutAscii::operator<<(pCVar1,*pcVar2);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<char> bVal){
            indent();
            (*ostream) << bVal.name();
            (*ostream) << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }